

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kd_tree_attributes_encoder.cc
# Opt level: O0

bool __thiscall
draco::KdTreeAttributesEncoder::EncodeDataNeededByPortableTransforms
          (KdTreeAttributesEncoder *this,EncoderBuffer *out_buffer)

{
  size_type sVar1;
  reference pvVar2;
  ulong uVar3;
  undefined8 in_RSI;
  long in_RDI;
  int i_1;
  int i;
  EncoderBuffer *in_stack_ffffffffffffffc8;
  int local_18;
  int local_14;
  
  local_14 = 0;
  while( true ) {
    sVar1 = std::
            vector<draco::AttributeQuantizationTransform,_std::allocator<draco::AttributeQuantizationTransform>_>
            ::size((vector<draco::AttributeQuantizationTransform,_std::allocator<draco::AttributeQuantizationTransform>_>
                    *)(in_RDI + 0x48));
    if (sVar1 <= (ulong)(long)local_14) break;
    pvVar2 = std::
             vector<draco::AttributeQuantizationTransform,_std::allocator<draco::AttributeQuantizationTransform>_>
             ::operator[]((vector<draco::AttributeQuantizationTransform,_std::allocator<draco::AttributeQuantizationTransform>_>
                           *)(in_RDI + 0x48),(long)local_14);
    (*(pvVar2->super_AttributeTransform)._vptr_AttributeTransform[7])(pvVar2,in_RSI);
    local_14 = local_14 + 1;
  }
  local_18 = 0;
  while( true ) {
    uVar3 = (ulong)local_18;
    sVar1 = std::vector<int,_std::allocator<int>_>::size
                      ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x60));
    if (sVar1 <= uVar3) break;
    std::vector<int,_std::allocator<int>_>::operator[]
              ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x60),(long)local_18);
    EncodeVarint<int>((int)uVar3,in_stack_ffffffffffffffc8);
    local_18 = local_18 + 1;
  }
  return true;
}

Assistant:

bool KdTreeAttributesEncoder::EncodeDataNeededByPortableTransforms(
    EncoderBuffer *out_buffer) {
  // Store quantization settings for all attributes that need it.
  for (int i = 0; i < attribute_quantization_transforms_.size(); ++i) {
    attribute_quantization_transforms_[i].EncodeParameters(out_buffer);
  }

  // Encode data needed for transforming signed integers to unsigned ones.
  for (int i = 0; i < min_signed_values_.size(); ++i) {
    EncodeVarint<int32_t>(min_signed_values_[i], out_buffer);
  }
  return true;
}